

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

string * __thiscall
Kernel::Clause::toNiceString_abi_cxx11_(string *__return_storage_ptr__,Clause *this)

{
  SplitSet *pSVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  string local_80;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  literalsOnlyToString_abi_cxx11_(__return_storage_ptr__,this);
  pSVar1 = (this->super_Unit)._inference._splits;
  if (pSVar1 == (SplitSet *)0x0) {
    return __return_storage_ptr__;
  }
  if (pSVar1->_size == 0) {
    return __return_storage_ptr__;
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," {","");
  ::Lib::SharedSet<unsigned_int>::toString_abi_cxx11_
            (&local_80,(this->super_Unit)._inference._splits);
  uVar5 = 0xf;
  if (local_60 != local_50) {
    uVar5 = local_50[0];
  }
  if (uVar5 < local_80._M_string_length + local_58) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar6 = local_80.field_2._M_allocated_capacity;
    }
    if (local_80._M_string_length + local_58 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_00528b77;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
LAB_00528b77:
  local_a0 = &local_90;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_90 = *plVar3;
    uStack_88 = puVar2[3];
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*puVar2;
  }
  local_98 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar3[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar3;
  }
  local_38 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40);
  if (local_40 != &local_30) {
    ::operator_delete(local_40,local_30 + 1);
  }
  if (local_a0 != &local_90) {
    ::operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    ::operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    ::operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Clause::toNiceString() const
{
  std::string result = literalsOnlyToString();

  if (splits() && !splits()->isEmpty()) {
    result += std::string(" {") + splits()->toString() + "}";
  }

  return result;
}